

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkDarClockGate(Abc_Ntk_t *pNtk,Abc_Ntk_t *pCare,Cgt_Par_t *pPars)

{
  Aig_Man_t *pAig;
  Aig_Man_t *pMan_00;
  Aig_Man_t *pMan;
  Aig_Man_t *pMan2;
  Aig_Man_t *pMan1;
  Abc_Ntk_t *pNtkAig;
  Cgt_Par_t *pPars_local;
  Abc_Ntk_t *pCare_local;
  Abc_Ntk_t *pNtk_local;
  
  pMan = (Aig_Man_t *)0x0;
  pAig = Abc_NtkToDar(pNtk,0,1);
  if (pAig == (Aig_Man_t *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else if ((pCare == (Abc_Ntk_t *)0x0) || (pMan = Abc_NtkToDar(pCare,0,0), pMan != (Aig_Man_t *)0x0)
          ) {
    pMan_00 = Cgt_ClockGating(pAig,pMan,pPars);
    Aig_ManStop(pAig);
    if (pMan != (Aig_Man_t *)0x0) {
      Aig_ManStop(pMan);
    }
    if (pMan_00 == (Aig_Man_t *)0x0) {
      pNtk_local = (Abc_Ntk_t *)0x0;
    }
    else {
      pNtk_local = Abc_NtkFromDar(pNtk,pMan_00);
      Aig_ManStop(pMan_00);
    }
  }
  else {
    Aig_ManStop(pAig);
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkDarClockGate( Abc_Ntk_t * pNtk, Abc_Ntk_t * pCare, Cgt_Par_t * pPars )
{
    Abc_Ntk_t * pNtkAig;
    Aig_Man_t * pMan1, * pMan2 = NULL, * pMan;
    pMan1 = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan1 == NULL )
        return NULL;
    if ( pCare )
    {
        pMan2 = Abc_NtkToDar( pCare, 0, 0 );
        if ( pMan2 == NULL )
        {
            Aig_ManStop( pMan1 );
            return NULL;
        }
    }
    pMan = Cgt_ClockGating( pMan1, pMan2, pPars );
    Aig_ManStop( pMan1 );
    if ( pMan2 )
        Aig_ManStop( pMan2 );
    if ( pMan == NULL )
        return NULL;
    pNtkAig = Abc_NtkFromDar( pNtk, pMan );
    Aig_ManStop( pMan );
    return pNtkAig;
}